

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AppendTarget
               (cmXMLWriter *xml,string *target,string *make,string *makeArgs,string *path,
               char *prefix,char *makeTarget)

{
  allocator<char> local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  local_38 = makeArgs;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"target",(allocator<char> *)&local_58);
  cmXMLWriter::StartElement(xml,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator+(&local_78,prefix,target);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"path",path);
  cmXMLWriter::Attribute<char[39]>
            (xml,"targetID",(char (*) [39])"org.eclipse.cdt.make.MakeTargetBuilder");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"buildCommand",&local_79);
  std::__cxx11::string::string((string *)&local_58,(string *)make);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"buildArguments",(allocator<char> *)&local_58);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"buildTarget",&local_79);
  if (makeTarget == (char *)0x0) {
    makeTarget = (target->_M_dataplus)._M_p;
  }
  local_58._M_dataplus._M_p = makeTarget;
  cmXMLWriter::Element<char_const*>(xml,&local_78,(char **)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"stopOnError",(allocator<char> *)&local_58);
  cmXMLWriter::Element<char[5]>(xml,&local_78,(char (*) [5])0x4b4546);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"useDefaultCommand",(allocator<char> *)&local_58);
  cmXMLWriter::Element<char[6]>(xml,&local_78,(char (*) [6])0x48b50b);
  std::__cxx11::string::~string((string *)&local_78);
  cmXMLWriter::EndElement(xml);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendTarget(
  cmXMLWriter& xml, const std::string& target, const std::string& make,
  const std::string& makeArgs, const std::string& path, const char* prefix,
  const char* makeTarget)
{
  xml.StartElement("target");
  xml.Attribute("name", prefix + target);
  xml.Attribute("path", path);
  xml.Attribute("targetID", "org.eclipse.cdt.make.MakeTargetBuilder");
  xml.Element("buildCommand",
              cmExtraEclipseCDT4Generator::GetEclipsePath(make));
  xml.Element("buildArguments", makeArgs);
  xml.Element("buildTarget", makeTarget ? makeTarget : target.c_str());
  xml.Element("stopOnError", "true");
  xml.Element("useDefaultCommand", "false");
  xml.EndElement();
}